

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_zipx_zstd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  void **a_00;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  void *local_c0;
  undefined1 local_a0 [8];
  ZSTD_inBuffer in;
  ZSTD_outBuffer out;
  uint64_t total_out;
  size_t ret;
  wchar_t r;
  void *compressed_buff;
  ssize_t to_consume;
  ssize_t in_bytes;
  ssize_t bytes_avail;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  in_bytes = 0;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if ((((zip *)bytes_avail)->decompress_init != '\0') ||
     (a_local._4_4_ = zipx_zstd_init(a,(zip *)bytes_avail), a_local._4_4_ == L'\0')) {
    local_a0 = (undefined1  [8])__archive_read_ahead((archive_read *)buff_local,1,&in_bytes);
    if (in_bytes < 0) {
      archive_set_error((archive *)buff_local,0x54,"Truncated zstd file body");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      if (*(long *)(bytes_avail + 0x78) < in_bytes) {
        local_c0 = *(void **)(bytes_avail + 0x78);
      }
      else {
        local_c0 = (void *)in_bytes;
      }
      if ((long)local_c0 < 1) {
        archive_set_error((archive *)buff_local,0x54,"Truncated zstd file body");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        in.src = local_c0;
        in.size = 0;
        in.pos = *(size_t *)(bytes_avail + 0xa8);
        lVar1 = *(long *)(bytes_avail + 0xb0);
        sVar3 = ZSTD_decompressStream
                          (*(ZSTD_DStream **)(bytes_avail + 0x218),(ZSTD_outBuffer *)&in.pos,
                           (ZSTD_inBuffer *)local_a0);
        uVar2 = ZSTD_isError(sVar3);
        a_00 = buff_local;
        if (uVar2 == 0) {
          if (((sVar3 == 0) && ((void *)in.size == in.src)) && (lVar1 != 0)) {
            *(undefined1 *)(bytes_avail + 0xa2) = 1;
            ZSTD_freeDStream(*(ZSTD_DStream **)(bytes_avail + 0x218));
            *(undefined1 *)(bytes_avail + 0x220) = 0;
          }
          sVar3 = in.size;
          __archive_read_consume((archive_read *)buff_local,in.size);
          *(size_t *)(bytes_avail + 0x78) = *(long *)(bytes_avail + 0x78) - sVar3;
          *(size_t *)(bytes_avail + 0x80) = sVar3 + *(long *)(bytes_avail + 0x80);
          *(undefined8 *)(bytes_avail + 0x88) = *(undefined8 *)(bytes_avail + 0x88);
          *offset_local = 0;
          *size_local = *(size_t *)(bytes_avail + 0xa8);
          a_local._4_4_ = consume_optional_marker((archive_read *)buff_local,(zip *)bytes_avail);
          if (a_local._4_4_ == L'\0') {
            a_local._4_4_ = L'\0';
          }
        }
        else {
          pcVar4 = ZSTD_getErrorName(sVar3);
          archive_set_error((archive *)a_00,-1,"Error during zstd decompression: %s",pcVar4);
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_data_zipx_zstd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip = (struct zip *)(a->format->data);
	ssize_t bytes_avail = 0, in_bytes, to_consume;
	const void *compressed_buff;
	int r;
	size_t ret;
	uint64_t total_out;
	ZSTD_outBuffer out;
	ZSTD_inBuffer in;

	(void) offset; /* UNUSED */

	/* Initialize decompression context if we're here for the first time. */
	if(!zip->decompress_init) {
		r = zipx_zstd_init(a, zip);
		if(r != ARCHIVE_OK)
			return r;
	}

	/* Fetch more compressed bytes */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zstd file body");
		return (ARCHIVE_FATAL);
	}

	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);
	if(in_bytes < 1) {
		/* zstd doesn't complain when caller feeds avail_in == 0.
		 * It will actually return success in this case, which is
		 * undesirable. This is why we need to make this check
		 * manually. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zstd file body");
		return (ARCHIVE_FATAL);
	}

	/* Setup buffer boundaries */
	in.src = compressed_buff;
	in.size = in_bytes;
	in.pos = 0;
	out = (ZSTD_outBuffer) { zip->uncompressed_buffer, zip->uncompressed_buffer_size, 0 };

	/* Perform the decompression. */
	ret = ZSTD_decompressStream(zip->zstdstream, &out, &in);
	if (ZSTD_isError(ret)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"Error during zstd decompression: %s",
			ZSTD_getErrorName(ret));
		return (ARCHIVE_FATAL);
	}

	/* Check end of the stream. */
	if (ret == 0) {
		if ((in.pos == in.size) && (out.pos < out.size)) {
			zip->end_of_entry = 1;
			ZSTD_freeDStream(zip->zstdstream);
			zip->zstdstream_valid = 0;
		}
	}

	/* Update the pointers so decompressor can continue decoding. */
	to_consume = in.pos;
	__archive_read_consume(a, to_consume);

	total_out = out.pos;

	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += total_out;

	/* Give libarchive its due. */
	*size = total_out;
	*buff = zip->uncompressed_buffer;

	/* Seek for optional marker, like in other entries. */
	r = consume_optional_marker(a, zip);
	if(r != ARCHIVE_OK)
		return r;

	return ARCHIVE_OK;
}